

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::GetPatternFunc::checkArguments
          (GetPatternFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4
          )

{
  Compilation *this_00;
  bool bVar1;
  bitwidth_t width;
  Type *pTVar2;
  
  this_00 = ((context->scope).ptr)->compilation;
  bVar1 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,1);
  if (!bVar1) {
    return this_00->errorType;
  }
  bVar1 = Type::isIntegral(((*args->_M_ptr)->type).ptr);
  if (bVar1) {
    width = Type::getBitWidth(((*args->_M_ptr)->type).ptr);
    pTVar2 = Compilation::getType(this_00,width,(bitmask<slang::ast::IntegralFlags>)0x0);
    return pTVar2;
  }
  pTVar2 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!args[0]->type->isIntegral())
            return badArg(context, *args[0]);

        return comp.getType(args[0]->type->getBitWidth(), {});
    }